

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys_test.cpp
# Opt level: O1

void __thiscall jbcoin::tests::ValidatorKeys_test::testWriteToFile(ValidatorKeys_test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  suite *psVar7;
  int iVar8;
  bool bVar9;
  string subdir;
  path keyFile;
  path conflictingPath;
  ValidatorKeys fileKeys;
  KeyFileGuard g;
  KeyFileGuard g_1;
  path keyFile_3;
  ValidatorKeys keys;
  KeyType keyType;
  string local_288;
  path local_268;
  path local_248;
  undefined1 local_228 [56];
  SecretKey local_1f0;
  uint32_t uStack_1d0;
  bool bStack_1cc;
  KeyFileGuard local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [56];
  SecretKey local_148;
  undefined5 uStack_128;
  path local_120;
  undefined1 local_100 [56];
  SecretKey local_c8;
  uint32_t local_a8;
  bool local_a4;
  KeyType local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  optional_base<jbcoin::ValidatorToken> local_78;
  
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Write to File","");
  psVar7 = (this->super_suite).testcase.suite_;
  psVar7->abort_ = false;
  beast::unit_test::runner::testcase<void>(psVar7->runner_,(string *)local_100);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  local_9c = ed25519;
  ValidatorKeys::ValidatorKeys((ValidatorKeys *)local_100,&local_9c);
  paVar1 = &local_288.field_2;
  local_288._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"test_key_file","");
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_228 + 0x10);
  local_228._0_8_ = paVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,local_288._M_dataplus._M_p,
             local_288._M_dataplus._M_p + local_288._M_string_length);
  pcVar5 = local_180 + 0x10;
  local_180._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"validator_keys.json","");
  boost::filesystem::path::operator/=((path *)local_228,(path *)local_180);
  paVar2 = &local_268.m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._0_8_ == paVar4) {
    local_268.m_pathname.field_2._8_8_ = local_228._24_8_;
    local_268.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_268.m_pathname._M_dataplus._M_p = (pointer)local_228._0_8_;
  }
  local_268.m_pathname.field_2._M_allocated_capacity._1_7_ = local_228._17_7_;
  local_268.m_pathname.field_2._M_local_buf[0] = local_228[0x10];
  local_268.m_pathname._M_string_length = local_228._8_8_;
  local_228._8_8_ = 0;
  local_228[0x10] = '\0';
  local_228._0_8_ = paVar4;
  if ((pointer)local_180._0_8_ != pcVar5) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._0_8_ != paVar4) {
    operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
  }
  KeyFileGuard::KeyFileGuard(&local_1c8,&this->super_suite,&local_288);
  ValidatorKeys::writeToFile((ValidatorKeys *)local_100,&local_268);
  boost::filesystem::detail::status((detail *)local_228,&local_268,(error_code *)0x0);
  local_180[0] = 1 < (uint)local_228._0_4_;
  beast::unit_test::suite::expect<bool,char[1]>
            (&this->super_suite,(bool *)local_180,(char (*) [1])0x280297,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x138);
  ValidatorKeys::make_ValidatorKeys((ValidatorKeys *)local_228,&local_268);
  if ((((local_a4 == bStack_1cc) && (local_100._0_4_ == local_228._0_4_)) &&
      (local_a8 == uStack_1d0)) && (local_100._8_8_ == local_228._8_8_)) {
    iVar8 = bcmp(local_100 + 0x10,local_228 + 0x10,local_228._8_8_);
    bVar9 = iVar8 == 0;
  }
  else {
    bVar9 = false;
  }
  local_180[0] = bVar9;
  beast::unit_test::suite::expect<bool,char[1]>
            (&this->super_suite,(bool *)local_180,(char (*) [1])0x280297,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x13b);
  local_180._0_8_ = local_180._0_8_ & 0xffffffff00000000;
  ValidatorKeys::createValidatorToken
            ((optional<jbcoin::ValidatorToken> *)&local_78,(ValidatorKeys *)local_100,
             (KeyType *)local_180);
  boost::optional_detail::optional_base<jbcoin::ValidatorToken>::~optional_base(&local_78);
  ValidatorKeys::writeToFile((ValidatorKeys *)local_100,&local_268);
  ValidatorKeys::make_ValidatorKeys((ValidatorKeys *)local_180,&local_268);
  local_228._0_4_ = local_180._0_4_;
  PublicKey::operator=((PublicKey *)(local_228 + 8),(PublicKey *)(local_180 + 8));
  uStack_1d0 = (uint32_t)uStack_128;
  bStack_1cc = SUB51(uStack_128,4);
  local_1f0.buf_[0x10] = local_148.buf_[0x10];
  local_1f0.buf_[0x11] = local_148.buf_[0x11];
  local_1f0.buf_[0x12] = local_148.buf_[0x12];
  local_1f0.buf_[0x13] = local_148.buf_[0x13];
  local_1f0.buf_[0x14] = local_148.buf_[0x14];
  local_1f0.buf_[0x15] = local_148.buf_[0x15];
  local_1f0.buf_[0x16] = local_148.buf_[0x16];
  local_1f0.buf_[0x17] = local_148.buf_[0x17];
  local_1f0.buf_[0] = local_148.buf_[0];
  local_1f0.buf_[1] = local_148.buf_[1];
  local_1f0.buf_[2] = local_148.buf_[2];
  local_1f0.buf_[3] = local_148.buf_[3];
  local_1f0.buf_[4] = local_148.buf_[4];
  local_1f0.buf_[5] = local_148.buf_[5];
  local_1f0.buf_[6] = local_148.buf_[6];
  local_1f0.buf_[7] = local_148.buf_[7];
  local_1f0.buf_[8] = local_148.buf_[8];
  local_1f0.buf_[9] = local_148.buf_[9];
  local_1f0.buf_[10] = local_148.buf_[10];
  local_1f0.buf_[0xb] = local_148.buf_[0xb];
  local_1f0.buf_[0xc] = local_148.buf_[0xc];
  local_1f0.buf_[0xd] = local_148.buf_[0xd];
  local_1f0.buf_[0xe] = local_148.buf_[0xe];
  local_1f0.buf_[0xf] = local_148.buf_[0xf];
  SecretKey::~SecretKey(&local_148);
  if (((local_a4 == bStack_1cc) && (local_100._0_4_ == local_228._0_4_)) &&
     ((local_a8 == uStack_1d0 && (local_100._8_8_ == local_228._8_8_)))) {
    iVar8 = bcmp(local_100 + 0x10,local_228 + 0x10,local_228._8_8_);
    bVar9 = iVar8 == 0;
  }
  else {
    bVar9 = false;
  }
  local_180[0] = bVar9;
  beast::unit_test::suite::expect<bool,char[1]>
            (&this->super_suite,(bool *)local_180,(char (*) [1])0x280297,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x142);
  SecretKey::~SecretKey(&local_1f0);
  KeyFileGuard::~KeyFileGuard(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.m_pathname._M_dataplus._M_p,
                    local_268.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  local_228._0_8_ = paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"test_validator_keys.json","")
  ;
  boost::filesystem::detail::status((detail *)local_180,(path *)local_228,(error_code *)0x0);
  if ((uint)local_180._0_4_ < 2) {
    ValidatorKeys::writeToFile((ValidatorKeys *)local_100,(path *)local_228);
    local_180._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_180,local_228._0_8_,(char *)(local_228._0_8_ + local_228._8_8_));
    boost::filesystem::detail::remove((path *)local_180,(error_code *)0x0);
    if ((pointer)local_180._0_8_ != pcVar5) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != paVar4) {
      operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
    }
    paVar3 = &local_1c8.subDir_.m_pathname.field_2;
    local_1c8.subDir_.m_pathname._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"test_key_file","");
    local_228._0_8_ = paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_228,local_1c8.subDir_.m_pathname._M_dataplus._M_p,
               local_1c8.subDir_.m_pathname._M_dataplus._M_p +
               local_1c8.subDir_.m_pathname._M_string_length);
    local_180._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_180,"directories/to/create/validator_keys.json","");
    boost::filesystem::path::operator/=((path *)local_228,(path *)local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ == paVar4) {
      local_288.field_2._8_8_ = local_228._24_8_;
      local_288._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_288._M_dataplus._M_p = (pointer)local_228._0_8_;
    }
    local_288.field_2._M_allocated_capacity._1_7_ = local_228._17_7_;
    local_288.field_2._M_local_buf[0] = local_228[0x10];
    local_288._M_string_length = local_228._8_8_;
    local_228._8_8_ = 0;
    local_228[0x10] = '\0';
    local_228._0_8_ = paVar4;
    if ((pointer)local_180._0_8_ != pcVar5) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != paVar4) {
      operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
    }
    KeyFileGuard::KeyFileGuard((KeyFileGuard *)local_180,&this->super_suite,(string *)&local_1c8);
    ValidatorKeys::writeToFile((ValidatorKeys *)local_100,(path *)&local_288);
    boost::filesystem::detail::status((detail *)local_228,(path *)&local_288,(error_code *)0x0);
    local_268.m_pathname._M_dataplus._M_p._0_1_ = 1 < (uint)local_228._0_4_;
    beast::unit_test::suite::expect<bool,char[1]>
              (&this->super_suite,(bool *)&local_268,(char (*) [1])0x280297,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x15c);
    ValidatorKeys::make_ValidatorKeys((ValidatorKeys *)local_228,(path *)&local_288);
    if (((local_a4 == bStack_1cc) && (local_100._0_4_ == local_228._0_4_)) &&
       ((local_a8 == uStack_1d0 && (local_100._8_8_ == local_228._8_8_)))) {
      iVar8 = bcmp(local_100 + 0x10,local_228 + 0x10,local_228._8_8_);
      bVar9 = iVar8 == 0;
    }
    else {
      bVar9 = false;
    }
    local_268.m_pathname._M_dataplus._M_p._0_1_ = bVar9;
    beast::unit_test::suite::expect<bool,char[1]>
              (&this->super_suite,(bool *)&local_268,(char (*) [1])0x280297,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x15f);
    SecretKey::~SecretKey(&local_1f0);
    KeyFileGuard::~KeyFileGuard((KeyFileGuard *)local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.subDir_.m_pathname._M_dataplus._M_p != paVar3) {
      operator_delete(local_1c8.subDir_.m_pathname._M_dataplus._M_p,
                      local_1c8.subDir_.m_pathname.field_2._M_allocated_capacity + 1);
    }
    local_180._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"test_key_file","");
    KeyFileGuard::KeyFileGuard((KeyFileGuard *)local_228,&this->super_suite,(string *)local_180);
    local_288._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,local_180._0_8_,(pointer)(local_180._0_8_ + local_180._8_8_));
    local_268.m_pathname._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,".","");
    boost::filesystem::path::operator/=((path *)&local_288,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p == paVar1) {
      local_1c8.subDir_.m_pathname.field_2._8_8_ = local_288.field_2._8_8_;
      local_1c8.subDir_.m_pathname._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_1c8.subDir_.m_pathname._M_dataplus._M_p = local_288._M_dataplus._M_p;
    }
    local_1c8.subDir_.m_pathname.field_2._M_allocated_capacity =
         local_288.field_2._M_allocated_capacity;
    local_1c8.subDir_.m_pathname._M_string_length = local_288._M_string_length;
    local_288._M_string_length = 0;
    local_288.field_2._M_allocated_capacity =
         local_288.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_288._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_268.m_pathname._M_dataplus._M_p,
                      local_268.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_288,"Cannot open key file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8);
    local_268.m_pathname._M_string_length = 0;
    local_268.m_pathname.field_2._M_allocated_capacity =
         local_268.m_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_268.m_pathname._M_dataplus._M_p = (pointer)paVar2;
    ValidatorKeys::writeToFile((ValidatorKeys *)local_100,&local_1c8.subDir_);
    if (local_268.m_pathname._M_string_length == local_288._M_string_length) {
      if (local_268.m_pathname._M_string_length == 0) {
        bVar9 = true;
      }
      else {
        iVar8 = bcmp(local_268.m_pathname._M_dataplus._M_p,local_288._M_dataplus._M_p,
                     local_268.m_pathname._M_string_length);
        bVar9 = iVar8 == 0;
      }
    }
    else {
      bVar9 = false;
    }
    local_120.m_pathname._M_dataplus._M_p._0_1_ = bVar9;
    beast::unit_test::suite::expect<bool,char[1]>
              (&this->super_suite,(bool *)&local_120,(char (*) [1])0x280297,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x16e);
    paVar3 = &local_248.m_pathname.field_2;
    local_248.m_pathname._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,local_180._0_8_,(pointer)(local_180._0_8_ + local_180._8_8_));
    paVar1 = &local_1a0.field_2;
    local_1a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"validator_keys.json","");
    boost::filesystem::path::operator/=(&local_248,(path *)&local_1a0);
    paVar6 = &local_120.m_pathname.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.m_pathname._M_dataplus._M_p == paVar3) {
      local_120.m_pathname.field_2._8_8_ = local_248.m_pathname.field_2._8_8_;
      local_120.m_pathname._M_dataplus._M_p = (pointer)paVar6;
    }
    else {
      local_120.m_pathname._M_dataplus._M_p = local_248.m_pathname._M_dataplus._M_p;
    }
    local_120.m_pathname.field_2._M_allocated_capacity._1_7_ =
         local_248.m_pathname.field_2._M_allocated_capacity._1_7_;
    local_120.m_pathname.field_2._M_local_buf[0] = local_248.m_pathname.field_2._M_local_buf[0];
    local_120.m_pathname._M_string_length = local_248.m_pathname._M_string_length;
    local_248.m_pathname._M_string_length = 0;
    local_248.m_pathname.field_2._M_local_buf[0] = '\0';
    local_248.m_pathname._M_dataplus._M_p = (pointer)paVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.m_pathname._M_dataplus._M_p != paVar3) {
      operator_delete(local_248.m_pathname._M_dataplus._M_p,
                      CONCAT71(local_248.m_pathname.field_2._M_allocated_capacity._1_7_,
                               local_248.m_pathname.field_2._M_local_buf[0]) + 1);
    }
    ValidatorKeys::writeToFile((ValidatorKeys *)local_100,&local_120);
    local_1a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"validators_keys.json","");
    local_248.m_pathname._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,local_120.m_pathname._M_dataplus._M_p,
               local_120.m_pathname._M_dataplus._M_p + local_120.m_pathname._M_string_length);
    boost::filesystem::path::operator/=(&local_248,(path *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    boost::filesystem::path::parent_path();
    std::operator+(&local_1a0,"Cannot create directory: ",&local_98);
    std::__cxx11::string::operator=((string *)&local_288,(string *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    ValidatorKeys::writeToFile((ValidatorKeys *)local_100,&local_248);
    if (local_268.m_pathname._M_string_length == local_288._M_string_length) {
      if (local_268.m_pathname._M_string_length == 0) {
        bVar9 = true;
      }
      else {
        iVar8 = bcmp(local_268.m_pathname._M_dataplus._M_p,local_288._M_dataplus._M_p,
                     local_268.m_pathname._M_string_length);
        bVar9 = iVar8 == 0;
      }
    }
    else {
      bVar9 = false;
    }
    local_1a0._M_dataplus._M_p._0_1_ = bVar9;
    beast::unit_test::suite::expect<bool,char[1]>
              (&this->super_suite,(bool *)&local_1a0,(char (*) [1])0x280297,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x17c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.m_pathname._M_dataplus._M_p != paVar3) {
      operator_delete(local_248.m_pathname._M_dataplus._M_p,
                      CONCAT71(local_248.m_pathname.field_2._M_allocated_capacity._1_7_,
                               local_248.m_pathname.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.m_pathname._M_dataplus._M_p != paVar6) {
      operator_delete(local_120.m_pathname._M_dataplus._M_p,
                      local_120.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_268.m_pathname._M_dataplus._M_p,
                      local_268.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.subDir_.m_pathname._M_dataplus._M_p != &local_1c8.subDir_.m_pathname.field_2) {
      operator_delete(local_1c8.subDir_.m_pathname._M_dataplus._M_p,
                      local_1c8.subDir_.m_pathname.field_2._M_allocated_capacity + 1);
    }
    KeyFileGuard::~KeyFileGuard((KeyFileGuard *)local_228);
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
    SecretKey::~SecretKey(&local_c8);
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                 "Cannot create key file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
  Throw<std::runtime_error,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
}

Assistant:

void
    testWriteToFile ()
    {
        testcase ("Write to File");

        using namespace boost::filesystem;

        auto const keyType = KeyType::ed25519;
        ValidatorKeys keys (keyType);

        {
            std::string const subdir = "test_key_file";
            path const keyFile = subdir / "validator_keys.json";
            KeyFileGuard g (*this, subdir);

            keys.writeToFile (keyFile);
            BEAST_EXPECT(exists (keyFile));

            auto fileKeys = ValidatorKeys::make_ValidatorKeys (keyFile);
            BEAST_EXPECT (keys == fileKeys);

            // Overwrite file with new sequence
            keys.createValidatorToken (KeyType::secp256k1);
            keys.writeToFile (keyFile);

            fileKeys = ValidatorKeys::make_ValidatorKeys (keyFile);
            BEAST_EXPECT (keys == fileKeys);
        }
        {
            // Write to key file in current relative directory
            path const keyFile = "test_validator_keys.json";
            if (!exists (keyFile))
            {
                keys.writeToFile (keyFile);
                remove (keyFile.string());
            }
            else
            {
                // Cannot run the test. Someone created a file
                // where we want to put our key file
                Throw<std::runtime_error> (
                    "Cannot create key file: " + keyFile.string ());
            }
        }
        {
            // Create key file directory
            std::string const subdir = "test_key_file";
            path const keyFile =
                subdir / "directories/to/create/validator_keys.json";
            KeyFileGuard g (*this, subdir);

            keys.writeToFile (keyFile);
            BEAST_EXPECT(exists (keyFile));

            auto const fileKeys = ValidatorKeys::make_ValidatorKeys (keyFile);
            BEAST_EXPECT (keys == fileKeys);
        }
        {
            // Fail if file cannot be opened for write
            std::string const subdir = "test_key_file";
            KeyFileGuard g (*this, subdir);

            path const badKeyFile = subdir / ".";
            auto expectedError = "Cannot open key file: " + badKeyFile.string();
            std::string error;
            try {
                keys.writeToFile (badKeyFile);
            } catch (std::runtime_error& e) {
                error = e.what();
            }
            BEAST_EXPECT(error == expectedError);

            // Fail if parent directory is existing file
            path const keyFile = subdir / "validator_keys.json";
            keys.writeToFile (keyFile);
            path const conflictingPath =
                keyFile / "validators_keys.json";
            expectedError = "Cannot create directory: " +
                conflictingPath.parent_path().string();
            try {
                keys.writeToFile (conflictingPath);
            } catch (std::runtime_error& e) {
                error = e.what();
            }
            BEAST_EXPECT(error == expectedError);
        }
    }